

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Type wasm::Type::
     getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
               (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *types)

{
  Type a;
  _Hash_node_base *p_Var1;
  
  p_Var1 = (types->_M_h)._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    a.id = (uintptr_t)p_Var1[1]._M_nxt;
    do {
      p_Var1 = p_Var1->_M_nxt;
      if (p_Var1 == (_Hash_node_base *)0x0) {
        return (Type)a.id;
      }
      a = getLeastUpperBound(a,(Type)p_Var1[1]._M_nxt);
    } while (a.id != 0);
  }
  return (Type)0;
}

Assistant:

static Type getLeastUpperBound(const T& types) {
    auto it = types.begin(), end = types.end();
    if (it == end) {
      return Type::none;
    }
    Type lub = *it++;
    for (; it != end; ++it) {
      lub = getLeastUpperBound(lub, *it);
      if (lub == Type::none) {
        return Type::none;
      }
    }
    return lub;
  }